

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolve.cpp
# Opt level: O1

HighsStatus solveLp(HighsLpSolverObject *solver_object,string *message)

{
  HighsLogOptions *log_options_;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *pfVar1;
  HighsOptions *options;
  pointer pcVar2;
  size_t sVar3;
  HighsInfo *pHVar4;
  double dVar5;
  size_type sVar6;
  bool bVar7;
  HighsStatus HVar8;
  HighsInt HVar9;
  int iVar10;
  HighsStatus HVar11;
  HighsDebugStatus HVar12;
  HighsModelStatus HVar13;
  string *psVar14;
  char *pcVar15;
  char *pcVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_2c0;
  string *local_2a0;
  string local_298;
  HighsLogOptions local_278;
  HighsLogOptions local_218;
  HighsLogOptions local_1b8;
  HighsLogOptions local_158;
  HighsLogOptions local_f8;
  HighsLogOptions local_98;
  
  options = solver_object->options_;
  resetModelStatusAndHighsInfo(solver_object);
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  pcVar2 = (message->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c0,pcVar2,pcVar2 + message->_M_string_length);
  std::__cxx11::string::append((char *)&local_2c0);
  log_options_ = &(options->super_HighsOptionsStruct).log_options;
  highsLogUser(log_options_,kInfo,local_2c0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p);
  }
  local_2a0 = message;
  if ((options->super_HighsOptionsStruct).highs_debug_level < 1) {
    HVar8 = kOk;
LAB_0025c958:
    if ((solver_object->lp_->num_row_ == 0) ||
       (HVar9 = HighsSparseMatrix::numNz(&solver_object->lp_->a_matrix_),
       sVar6 = kIpmString_abi_cxx11_._M_string_length, HVar9 == 0)) {
      HVar11 = solveUnconstrainedLp
                         (solver_object->options_,solver_object->lp_,&solver_object->model_status_,
                          solver_object->highs_info_,solver_object->solution_,solver_object->basis_)
      ;
      local_f8.log_stream = log_options_->log_stream;
      local_f8.output_flag = (options->super_HighsOptionsStruct).log_options.output_flag;
      local_f8.log_to_console = (options->super_HighsOptionsStruct).log_options.log_to_console;
      local_f8.log_dev_level = (options->super_HighsOptionsStruct).log_options.log_dev_level;
      local_f8.user_log_callback = (options->super_HighsOptionsStruct).log_options.user_log_callback
      ;
      local_f8.user_log_callback_data =
           (options->super_HighsOptionsStruct).log_options.user_log_callback_data;
      pfVar1 = &local_f8.user_callback;
      std::
      function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
      ::function(pfVar1,&(options->super_HighsOptionsStruct).log_options.user_callback);
      local_f8.user_callback_active =
           (options->super_HighsOptionsStruct).log_options.user_callback_active;
      local_f8.user_callback_data =
           (options->super_HighsOptionsStruct).log_options.user_callback_data;
      local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2c0,"solveUnconstrainedLp","");
      HVar8 = interpretCallStatus(&local_f8,HVar11,HVar8,&local_2c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p);
      }
      if (local_f8.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_f8.user_callback.super__Function_base._M_manager)
                  ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
      }
      if (HVar8 == kError) goto LAB_0025cbd5;
    }
    else {
      sVar3 = (options->super_HighsOptionsStruct).solver._M_string_length;
      if ((((sVar3 == kIpmString_abi_cxx11_._M_string_length) &&
           ((sVar3 == 0 ||
            (iVar10 = bcmp((options->super_HighsOptionsStruct).solver._M_dataplus._M_p,
                           kIpmString_abi_cxx11_._M_dataplus._M_p,sVar3), iVar10 == 0)))) ||
          ((options->super_HighsOptionsStruct).run_centring != false)) ||
         ((sVar3 == kPdlpString_abi_cxx11_._M_string_length &&
          ((sVar3 == 0 ||
           (iVar10 = bcmp((options->super_HighsOptionsStruct).solver._M_dataplus._M_p,
                          kPdlpString_abi_cxx11_._M_dataplus._M_p,sVar3), iVar10 == 0)))))) {
        if (((sVar3 == sVar6) &&
            ((sVar3 == 0 ||
             (iVar10 = bcmp((options->super_HighsOptionsStruct).solver._M_dataplus._M_p,
                            kIpmString_abi_cxx11_._M_dataplus._M_p,sVar3), iVar10 == 0)))) ||
           ((options->super_HighsOptionsStruct).run_centring == true)) {
          HVar11 = solveLpIpx(solver_object);
          local_158.log_stream = log_options_->log_stream;
          local_158.output_flag = (options->super_HighsOptionsStruct).log_options.output_flag;
          local_158.log_to_console = (options->super_HighsOptionsStruct).log_options.log_to_console;
          local_158.log_dev_level = (options->super_HighsOptionsStruct).log_options.log_dev_level;
          local_158.user_log_callback =
               (options->super_HighsOptionsStruct).log_options.user_log_callback;
          local_158.user_log_callback_data =
               (options->super_HighsOptionsStruct).log_options.user_log_callback_data;
          pfVar1 = &local_158.user_callback;
          std::
          function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
          ::function(pfVar1,&(options->super_HighsOptionsStruct).log_options.user_callback);
          local_158.user_callback_active =
               (options->super_HighsOptionsStruct).log_options.user_callback_active;
          local_158.user_callback_data =
               (options->super_HighsOptionsStruct).log_options.user_callback_data;
          local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"solveLpIpx","");
          HVar8 = interpretCallStatus(&local_158,HVar11,HVar8,&local_2c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
            operator_delete(local_2c0._M_dataplus._M_p);
          }
          if (local_158.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
            (*local_158.user_callback.super__Function_base._M_manager)
                      ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
          }
        }
        else {
          HVar11 = solveLpCupdlp(solver_object);
          local_1b8.log_stream = log_options_->log_stream;
          local_1b8.output_flag = (options->super_HighsOptionsStruct).log_options.output_flag;
          local_1b8.log_to_console = (options->super_HighsOptionsStruct).log_options.log_to_console;
          local_1b8.log_dev_level = (options->super_HighsOptionsStruct).log_options.log_dev_level;
          local_1b8.user_log_callback =
               (options->super_HighsOptionsStruct).log_options.user_log_callback;
          local_1b8.user_log_callback_data =
               (options->super_HighsOptionsStruct).log_options.user_log_callback_data;
          pfVar1 = &local_1b8.user_callback;
          std::
          function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
          ::function(pfVar1,&(options->super_HighsOptionsStruct).log_options.user_callback);
          local_1b8.user_callback_active =
               (options->super_HighsOptionsStruct).log_options.user_callback_active;
          local_1b8.user_callback_data =
               (options->super_HighsOptionsStruct).log_options.user_callback_data;
          local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"solveLpCupdlp","");
          HVar8 = interpretCallStatus(&local_1b8,HVar11,HVar8,&local_2c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
            operator_delete(local_2c0._M_dataplus._M_p);
          }
          if (local_1b8.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
            (*local_1b8.user_callback.super__Function_base._M_manager)
                      ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
          }
        }
        if (HVar8 == kError) {
          return kError;
        }
        correctResiduals(solver_object);
        dVar5 = HighsLp::objectiveValue(solver_object->lp_,&solver_object->solution_->col_value);
        pHVar4 = solver_object->highs_info_;
        (pHVar4->super_HighsInfoStruct).objective_function_value = dVar5;
        getLpKktFailures(options,solver_object->lp_,solver_object->solution_,solver_object->basis_,
                         pHVar4);
        if ((solver_object->model_status_ == kOptimal) &&
           ((0 < (solver_object->highs_info_->super_HighsInfoStruct).num_primal_infeasibilities ||
            ((solver_object->highs_info_->super_HighsInfoStruct).num_dual_infeasibilities != 0)))) {
          solver_object->model_status_ = kUnknown;
        }
        sVar3 = (options->super_HighsOptionsStruct).solver._M_string_length;
        if (((sVar3 == kIpmString_abi_cxx11_._M_string_length) &&
            ((sVar3 == 0 ||
             (iVar10 = bcmp((options->super_HighsOptionsStruct).solver._M_dataplus._M_p,
                            kIpmString_abi_cxx11_._M_dataplus._M_p,sVar3), iVar10 == 0)))) ||
           ((options->super_HighsOptionsStruct).run_centring == true)) {
          HVar13 = solver_object->model_status_;
          bVar7 = true;
          if ((HVar13 == kUnknown) ||
             ((HVar13 == kUnboundedOrInfeasible &&
              ((options->super_HighsOptionsStruct).allow_unbounded_or_infeasible == false)))) {
            utilModelStatusToString_abi_cxx11_(&local_2c0,HVar13);
            pcVar16 = "not ";
            pcVar15 = "not ";
            if (solver_object->basis_->valid != false) {
              pcVar15 = "";
            }
            if (solver_object->solution_->value_valid != false) {
              pcVar16 = "";
            }
            psVar14 = &kHighsOffString_abi_cxx11_;
            if ((options->super_HighsOptionsStruct).run_centring == false) {
              psVar14 = &(options->super_HighsOptionsStruct).run_crossover;
            }
            highsLogUser(log_options_,kWarning,
                         "Unwelcome IPX status of %s: basis is %svalid; solution is %svalid; run_crossover is \"%s\"\n"
                         ,local_2c0._M_dataplus._M_p,pcVar15,pcVar16,(psVar14->_M_dataplus)._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
              operator_delete(local_2c0._M_dataplus._M_p);
            }
            sVar3 = (options->super_HighsOptionsStruct).run_crossover._M_string_length;
            if (((sVar3 == kHighsOffString_abi_cxx11_._M_string_length) &&
                ((sVar3 == 0 ||
                 (iVar10 = bcmp((options->super_HighsOptionsStruct).run_crossover._M_dataplus._M_p,
                                kHighsOffString_abi_cxx11_._M_dataplus._M_p,sVar3), iVar10 == 0))))
               || ((options->super_HighsOptionsStruct).run_centring != false)) {
LAB_0025d041:
              bVar7 = true;
            }
            else {
              highsLogUser(log_options_,kWarning,
                           "IPX solution is imprecise, so clean up with simplex\n");
              HVar8 = solveLpSimplex(solver_object);
              local_218.log_stream = log_options_->log_stream;
              local_218.output_flag = (options->super_HighsOptionsStruct).log_options.output_flag;
              local_218.log_to_console =
                   (options->super_HighsOptionsStruct).log_options.log_to_console;
              local_218.log_dev_level =
                   (options->super_HighsOptionsStruct).log_options.log_dev_level;
              local_218.user_log_callback =
                   (options->super_HighsOptionsStruct).log_options.user_log_callback;
              local_218.user_log_callback_data =
                   (options->super_HighsOptionsStruct).log_options.user_log_callback_data;
              pfVar1 = &local_218.user_callback;
              std::
              function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
              ::function(pfVar1,&(options->super_HighsOptionsStruct).log_options.user_callback);
              local_218.user_callback_active =
                   (options->super_HighsOptionsStruct).log_options.user_callback_active;
              local_218.user_callback_data =
                   (options->super_HighsOptionsStruct).log_options.user_callback_data;
              local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_2c0,"solveLpSimplex","");
              HVar8 = interpretCallStatus(&local_218,HVar8,kOk,&local_2c0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
                operator_delete(local_2c0._M_dataplus._M_p);
              }
              if (local_218.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
                (*local_218.user_callback.super__Function_base._M_manager)
                          ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
              }
              if (HVar8 == kError) {
                HVar8 = kError;
              }
              else {
                bVar7 = isSolutionRightSize(solver_object->lp_,solver_object->solution_);
                if (bVar7) goto LAB_0025d041;
                highsLogUser(log_options_,kError,"Inconsistent solution returned from solver\n");
              }
              bVar7 = false;
            }
          }
          if (!bVar7) {
            return kError;
          }
        }
        else {
          pHVar4 = solver_object->highs_info_;
          if (solver_object->model_status_ == kUnboundedOrInfeasible) {
            if ((pHVar4->super_HighsInfoStruct).num_primal_infeasibilities == 0) {
              HVar13 = kUnbounded;
              goto LAB_0025d0dc;
            }
          }
          else if (solver_object->model_status_ == kOptimal) {
            if ((pHVar4->super_HighsInfoStruct).num_primal_infeasibilities == 0) {
              if ((pHVar4->super_HighsInfoStruct).num_dual_infeasibilities == 0) goto LAB_0025cb84;
              if ((pHVar4->super_HighsInfoStruct).num_dual_infeasibilities != 0) {
                uVar17 = SUB84((pHVar4->super_HighsInfoStruct).max_dual_infeasibility,0);
                uVar18 = SUB84((pHVar4->super_HighsInfoStruct).sum_dual_infeasibilities,0);
                pcVar15 = 
                "PDLP claims optimality, but with num/max/sum %d / %9.4g / %9.4g dual infeasibilities\n"
                ;
                goto LAB_0025d078;
              }
            }
            else {
              uVar17 = SUB84((pHVar4->super_HighsInfoStruct).max_primal_infeasibility,0);
              uVar18 = SUB84((pHVar4->super_HighsInfoStruct).sum_primal_infeasibilities,0);
              pcVar15 = 
              "PDLP claims optimality, but with num/max/sum %d / %9.4g / %9.4g primal infeasibilities\n"
              ;
LAB_0025d078:
              highsLogUser(log_options_,kWarning,pcVar15,uVar17,uVar18);
            }
            highsLogUser(log_options_,kWarning,
                         "                        and          max/sum     %9.4g / %9.4g complementarity violations\n"
                         ,SUB84((pHVar4->super_HighsInfoStruct).max_complementarity_violation,0),
                         SUB84((pHVar4->super_HighsInfoStruct).sum_complementarity_violations,0));
            highsLogUser(log_options_,kWarning,
                         "                        so set model status to \"unknown\"\n");
            HVar13 = kUnknown;
LAB_0025d0dc:
            solver_object->model_status_ = HVar13;
          }
        }
      }
      else {
        HVar11 = solveLpSimplex(solver_object);
        local_278.log_stream = log_options_->log_stream;
        local_278.output_flag = (options->super_HighsOptionsStruct).log_options.output_flag;
        local_278.log_to_console = (options->super_HighsOptionsStruct).log_options.log_to_console;
        local_278.log_dev_level = (options->super_HighsOptionsStruct).log_options.log_dev_level;
        local_278.user_log_callback =
             (options->super_HighsOptionsStruct).log_options.user_log_callback;
        local_278.user_log_callback_data =
             (options->super_HighsOptionsStruct).log_options.user_log_callback_data;
        pfVar1 = &local_278.user_callback;
        std::
        function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
        ::function(pfVar1,&(options->super_HighsOptionsStruct).log_options.user_callback);
        local_278.user_callback_active =
             (options->super_HighsOptionsStruct).log_options.user_callback_active;
        local_278.user_callback_data =
             (options->super_HighsOptionsStruct).log_options.user_callback_data;
        local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"solveLpSimplex","");
        HVar8 = interpretCallStatus(&local_278,HVar11,HVar8,&local_2c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          operator_delete(local_2c0._M_dataplus._M_p);
        }
        if (local_278.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_278.user_callback.super__Function_base._M_manager)
                    ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
        }
        if (HVar8 == kError) {
          return kError;
        }
        bVar7 = isSolutionRightSize(solver_object->lp_,solver_object->solution_);
        if (!bVar7) {
          highsLogUser(log_options_,kError,"Inconsistent solution returned from solver\n");
          return kError;
        }
      }
    }
LAB_0025cb84:
    pcVar2 = (local_2a0->_M_dataplus)._M_p;
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_298,pcVar2,pcVar2 + local_2a0->_M_string_length);
    HVar12 = debugHighsLpSolution(&local_298,solver_object);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p);
    }
    if (HVar12 == kLogicalError) {
      HVar8 = kError;
    }
  }
  else {
    HVar8 = assessLp(solver_object->lp_,options);
    local_98.log_stream = log_options_->log_stream;
    local_98.output_flag = (options->super_HighsOptionsStruct).log_options.output_flag;
    local_98.log_to_console = (options->super_HighsOptionsStruct).log_options.log_to_console;
    local_98.log_dev_level = (options->super_HighsOptionsStruct).log_options.log_dev_level;
    local_98.user_log_callback = (options->super_HighsOptionsStruct).log_options.user_log_callback;
    local_98.user_log_callback_data =
         (options->super_HighsOptionsStruct).log_options.user_log_callback_data;
    pfVar1 = &local_98.user_callback;
    std::
    function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
    ::function(pfVar1,&(options->super_HighsOptionsStruct).log_options.user_callback);
    local_98.user_callback_active =
         (options->super_HighsOptionsStruct).log_options.user_callback_active;
    local_98.user_callback_data = (options->super_HighsOptionsStruct).log_options.user_callback_data
    ;
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"assessLp","");
    HVar8 = interpretCallStatus(&local_98,HVar8,kOk,&local_2c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p);
    }
    if (local_98.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_98.user_callback.super__Function_base._M_manager)
                ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
    }
    if (HVar8 != kError) goto LAB_0025c958;
LAB_0025cbd5:
    HVar8 = kError;
  }
  return HVar8;
}

Assistant:

HighsStatus solveLp(HighsLpSolverObject& solver_object, const string message) {
  HighsStatus return_status = HighsStatus::kOk;
  HighsStatus call_status;
  HighsOptions& options = solver_object.options_;
  // Reset unscaled model status and solution params - except for
  // iteration counts
  resetModelStatusAndHighsInfo(solver_object);
  highsLogUser(options.log_options, HighsLogType::kInfo,
               (message + "\n").c_str());
  if (options.highs_debug_level > kHighsDebugLevelMin) {
    // Shouldn't have to check validity of the LP since this is done when it is
    // loaded or modified
    call_status = assessLp(solver_object.lp_, options);
    // If any errors have been found or normalisation carried out,
    // call_status will be ERROR or WARNING, so only valid return is OK.
    assert(call_status == HighsStatus::kOk);
    return_status = interpretCallStatus(options.log_options, call_status,
                                        return_status, "assessLp");
    if (return_status == HighsStatus::kError) return return_status;
  }
  if (!solver_object.lp_.num_row_ || solver_object.lp_.a_matrix_.numNz() == 0) {
    // LP is unconstrained due to having no rows or a zero constraint
    // matrix, so solve directly
    call_status = solveUnconstrainedLp(solver_object);
    return_status = interpretCallStatus(options.log_options, call_status,
                                        return_status, "solveUnconstrainedLp");
    if (return_status == HighsStatus::kError) return return_status;
  } else if (options.solver == kIpmString || options.run_centring ||
             options.solver == kPdlpString) {
    // Use IPM or PDLP
    if (options.solver == kIpmString || options.run_centring) {
      // Use IPX to solve the LP
      try {
        call_status = solveLpIpx(solver_object);
      } catch (const std::exception& exception) {
        highsLogDev(options.log_options, HighsLogType::kError,
                    "Exception %s in solveLpIpx\n", exception.what());
        call_status = HighsStatus::kError;
      }
      return_status = interpretCallStatus(options.log_options, call_status,
                                          return_status, "solveLpIpx");
    } else {
      // Use cuPDLP-C to solve the LP
      try {
        call_status = solveLpCupdlp(solver_object);
      } catch (const std::exception& exception) {
        highsLogDev(options.log_options, HighsLogType::kError,
                    "Exception %s in solveLpCupdlp\n", exception.what());
        call_status = HighsStatus::kError;
      }
      return_status = interpretCallStatus(options.log_options, call_status,
                                          return_status, "solveLpCupdlp");
    }
    if (return_status == HighsStatus::kError) return return_status;
    // IPM (and PDLP?) can claim optimality with large primal and/or
    // dual residual errors, so must correct any residual errors that
    // exceed the tolerance in this scenario.
    //
    // OK to correct residual errors whatever the model status, as
    // it's only changed in the case of optimality
    correctResiduals(solver_object);

    // Non-error return requires a primal solution
    assert(solver_object.solution_.value_valid);
    // Get the objective and any KKT failures
    solver_object.highs_info_.objective_function_value =
        solver_object.lp_.objectiveValue(solver_object.solution_.col_value);
    getLpKktFailures(options, solver_object.lp_, solver_object.solution_,
                     solver_object.basis_, solver_object.highs_info_);
    if (solver_object.model_status_ == HighsModelStatus::kOptimal &&
        (solver_object.highs_info_.num_primal_infeasibilities > 0 ||
         solver_object.highs_info_.num_dual_infeasibilities))
      solver_object.model_status_ = HighsModelStatus::kUnknown;
    if (options.solver == kIpmString || options.run_centring) {
      // Setting the IPM-specific values of (highs_)info_ has been done in
      // solveLpIpx
      const bool unwelcome_ipx_status =
          solver_object.model_status_ == HighsModelStatus::kUnknown ||
          (solver_object.model_status_ ==
               HighsModelStatus::kUnboundedOrInfeasible &&
           !options.allow_unbounded_or_infeasible);
      if (unwelcome_ipx_status) {
        // When performing an analytic centre calculation, the setting
        // of options.run_crossover is ignored, so simplex clean-up is
        // not possible - or desirable, anyway!
        highsLogUser(
            options.log_options, HighsLogType::kWarning,
            "Unwelcome IPX status of %s: basis is %svalid; solution is "
            "%svalid; run_crossover is \"%s\"\n",
            utilModelStatusToString(solver_object.model_status_).c_str(),
            solver_object.basis_.valid ? "" : "not ",
            solver_object.solution_.value_valid ? "" : "not ",
            options.run_centring ? kHighsOffString.c_str()
                                 : options.run_crossover.c_str());
        const bool allow_simplex_cleanup =
            options.run_crossover != kHighsOffString && !options.run_centring;
        if (allow_simplex_cleanup) {
          // IPX has returned a model status that HiGHS would rather
          // avoid, so perform simplex clean-up if crossover was allowed.
          //
          // This is an unusual situation, and the cost will usually be
          // acceptable. Worst case is if crossover wasn't run, in which
          // case there's no basis to start simplex
          //
          // ToDo: Check whether simplex can exploit the primal solution
          // returned by IPX
          highsLogUser(options.log_options, HighsLogType::kWarning,
                       "IPX solution is imprecise, so clean up with simplex\n");
          // Reset the return status since it will now be determined by
          // the outcome of the simplex solve
          return_status = HighsStatus::kOk;
          call_status = solveLpSimplex(solver_object);
          return_status = interpretCallStatus(options.log_options, call_status,
                                              return_status, "solveLpSimplex");
          if (return_status == HighsStatus::kError) return return_status;
          if (!isSolutionRightSize(solver_object.lp_,
                                   solver_object.solution_)) {
            highsLogUser(options.log_options, HighsLogType::kError,
                         "Inconsistent solution returned from solver\n");
            return HighsStatus::kError;
          }
        }  // options.run_crossover == kHighsOnString
           // clang-format off
      }  // unwelcome_ipx_status
      // clang-format on
    } else {
      // PDLP has been used, so check whether claim of optimality
      // satisfies the HiGHS criteria
      //
      // Even when PDLP terminates with primal and dual feasibility
      // and duality gap that are within the tolerances supplied by
      // HiGHS, the HiGHS primal and dual feasibility tolerances may
      // not be satisfied since they are absolute, and in PDLP they
      // are relative. Note that, even when only one PDLP row activity
      // fails to satisfy the absolute tolerance, the absolute norm
      // measure reported by PDLP will not necessarily be the same as
      // with HiGHS, since PDLP uses the 2-norm, and HiGHS the
      // infinity- and 1-norm
      //
      // A single small HiGHS primal infeasibility from PDLP can yield
      // a significant dual infeasibility, since the variable is
      // interpreted as being off its bound so any dual value is an
      // infeasibility. Hence, for context, the max and sum of
      // complementarity violations are also computed.
      const HighsInfo& info = solver_object.highs_info_;
      if (solver_object.model_status_ == HighsModelStatus::kOptimal) {
        if (info.num_primal_infeasibilities || info.num_dual_infeasibilities) {
          if (info.num_primal_infeasibilities) {
            highsLogUser(options.log_options, HighsLogType::kWarning,
                         "PDLP claims optimality, but with num/max/sum %d / "
                         "%9.4g / %9.4g primal infeasibilities\n",
                         int(info.num_primal_infeasibilities),
                         info.max_primal_infeasibility,
                         info.sum_primal_infeasibilities);
          } else if (info.num_dual_infeasibilities) {
            highsLogUser(options.log_options, HighsLogType::kWarning,
                         "PDLP claims optimality, but with num/max/sum %d / "
                         "%9.4g / %9.4g dual infeasibilities\n",
                         int(info.num_dual_infeasibilities),
                         info.max_dual_infeasibility,
                         info.sum_dual_infeasibilities);
          }
          highsLogUser(options.log_options, HighsLogType::kWarning,
                       "                        and          max/sum     %9.4g "
                       "/ %9.4g complementarity violations\n",
                       info.max_complementarity_violation,
                       info.sum_complementarity_violations);
          highsLogUser(
              options.log_options, HighsLogType::kWarning,
              "                        so set model status to \"unknown\"\n");
          solver_object.model_status_ = HighsModelStatus::kUnknown;
        }
      } else if (solver_object.model_status_ ==
                 HighsModelStatus::kUnboundedOrInfeasible) {
        if (info.num_primal_infeasibilities == 0)
          solver_object.model_status_ = HighsModelStatus::kUnbounded;
      }
    }
  } else {
    // Use Simplex
    call_status = solveLpSimplex(solver_object);
    return_status = interpretCallStatus(options.log_options, call_status,
                                        return_status, "solveLpSimplex");
    if (return_status == HighsStatus::kError) return return_status;
    if (!isSolutionRightSize(solver_object.lp_, solver_object.solution_)) {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "Inconsistent solution returned from solver\n");
      return HighsStatus::kError;
    }
  }
  // Analyse the HiGHS (basic) solution
  if (debugHighsLpSolution(message, solver_object) ==
      HighsDebugStatus::kLogicalError)
    return_status = HighsStatus::kError;
  return return_status;
}